

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O0

TypeRef clickhouse::Type::CreateString(size_t n)

{
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Type *in_RSI;
  element_type *in_RDI;
  TypeRef TVar2;
  TypeRef *type;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  int iVar3;
  element_type *this;
  uint3 in_stack_ffffffffffffffec;
  Code code;
  
  code = (Code)in_stack_ffffffffffffffec;
  this = in_RDI;
  operator_new(0x10);
  Type(in_RSI,code);
  iVar3 = (int)in_RSI;
  std::shared_ptr<clickhouse::Type>::shared_ptr<clickhouse::Type,void>
            ((shared_ptr<clickhouse::Type> *)this,
             (Type *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  peVar1 = std::__shared_ptr_access<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x2459a3);
  (peVar1->field_1).string_size_ = iVar3;
  TVar2.super___shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  TVar2.super___shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (TypeRef)TVar2.super___shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

TypeRef Type::CreateString(size_t n) {
    TypeRef type(new Type(Type::FixedString));
    type->string_size_ = n;
    return type;
}